

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::(anonymous_namespace)::test<vk::VkCommandBuffer_s*>
          (TestStatus *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context)

{
  size_t sVar1;
  DeviceInterface *pDVar2;
  VkDevice device;
  DeviceInterface *pDVar3;
  VkAllocationCallbacks *allocator;
  VkCommandBuffer pNullHandles [3];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  Move<vk::Handle<(vk::HandleType)24>_> local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_c8 [8];
  VkAllocationCallbacks VStack_c0;
  size_t local_80;
  Move<vk::Handle<(vk::HandleType)24>_> local_68;
  VkCommandPoolCreateInfo local_40;
  
  pDVar2 = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  local_40.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_40.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_40.pNext = (void *)0x0;
  local_40.flags = 1;
  local_d8 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  ::vk::createCommandPool(&local_108,pDVar2,device,&local_40,(VkAllocationCallbacks *)0x0);
  VStack_c0.pfnAllocation =
       (PFN_vkAllocationFunction)
       local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  VStack_c0.pfnReallocation =
       (PFN_vkReallocationFunction)
       local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_c8 = (undefined1  [8])
             local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  VStack_c0.pUserData =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  pDVar3 = Context::getDeviceInterface((Context *)this);
  (*pDVar3->_vptr_DeviceInterface[0x48])
            (pDVar3,device,
             local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,3,
             &local_e8);
  if (local_c8 != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_c8 + 8),(VkCommandPool)local_c8);
  }
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_c8,allocator,1);
  ::vk::createCommandPool(&local_68,pDVar2,device,&local_40,(VkAllocationCallbacks *)(local_c8 + 8))
  ;
  sVar1 = local_80;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  pDVar2 = Context::getDeviceInterface((Context *)this);
  (*pDVar2->_vptr_DeviceInterface[0x48])
            (pDVar2,device,
             local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,3,
             &local_e8);
  api::anon_unknown_1::reportStatus(__return_storage_ptr__,sVar1 == local_80);
  if (local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_108.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test<VkCommandBuffer> (Context& context)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo	cmdPoolCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,		// VkStructureType             sType;
		DE_NULL,										// const void*                 pNext;
		VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// VkCommandPoolCreateFlags    flags;
		queueFamilyIndex,								// uint32_t                    queueFamilyIndex;
	};

	const VkCommandBuffer			pNullHandles[]		= { DE_NULL, DE_NULL, DE_NULL };
	const deUint32					numHandles			= static_cast<deUint32>(DE_LENGTH_OF_ARRAY(pNullHandles));

	// Default allocator
	{
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));

		release(context, device, *cmdPool, numHandles, pNullHandles);
	}

	// Custom allocator
	{
		AllocationCallbackRecorder		recordingAllocator	(getSystemAllocator(), 1u);
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo, recordingAllocator.getCallbacks()));
		const std::size_t				numInitialRecords	= recordingAllocator.getNumRecords();

		release(context, device, *cmdPool, numHandles, pNullHandles);

		return reportStatus(numInitialRecords == recordingAllocator.getNumRecords());
	}
}